

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O0

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar40;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar41 [16];
  __m128i _tmp3_2;
  __m128i _tmp2_2;
  __m128i _tmp1_2;
  __m128i _tmp0_2;
  __m128i _w3_1;
  __m128i _w2_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _extw23_1;
  __m128i _extw01_1;
  __m128i _w23_1;
  __m128i _w01_1;
  __m128i _val;
  int j_1;
  __m128i _sum3;
  __m128i _sum2;
  __m128i _sum1;
  __m128i _sum0;
  int nn_1;
  char *kptr0_1;
  char *tmpptr_3;
  __m128i _tmp3_1;
  __m128i _tmp2_1;
  __m128i _tmp1_1;
  __m128i _tmp0_1;
  __m128i _tmp3;
  __m128i _tmp2;
  __m128i _tmp1;
  __m128i _tmp0;
  __m128i _w3;
  __m128i _w2;
  __m128i _w1;
  __m128i _w0;
  __m128i _extw23;
  __m128i _extw01;
  __m128i _w23;
  __m128i _w01;
  __m128i _val1;
  __m128i _val0;
  __m128i _extval01;
  __m128i _val01;
  int j;
  __m128i _sum13;
  __m128i _sum12;
  __m128i _sum11;
  __m128i _sum10;
  __m128i _sum03;
  __m128i _sum02;
  __m128i _sum01;
  __m128i _sum00;
  int nn;
  char *kptr0;
  char *tmpptr_2;
  int i_2;
  int *outptr0;
  int p;
  int k_1;
  int64_t *img0_1;
  int q_1;
  int64_t *tmpptr_1;
  int i_1;
  __m128i _v;
  int k;
  int64_t *img0;
  int q;
  int64_t *tmpptr;
  int i;
  int ii;
  int nn_size;
  int remain_size_start;
  Mat tmp;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_8;
  Mat *m_6;
  Mat *m_3;
  Mat *m_1;
  Option *in_stack_ffffffffffffe068;
  Mat *in_stack_ffffffffffffe070;
  Mat *in_stack_ffffffffffffe078;
  Mat *in_stack_ffffffffffffe080;
  void **ppvVar42;
  size_t in_stack_ffffffffffffe088;
  int in_stack_ffffffffffffe094;
  undefined8 in_stack_ffffffffffffe098;
  int _w;
  Mat *in_stack_ffffffffffffe0a0;
  undefined8 local_1f58;
  undefined4 in_stack_ffffffffffffe100;
  undefined4 in_stack_ffffffffffffe104;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined8 local_1ed8;
  undefined8 uStack_1ed0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1d28;
  undefined8 local_1d08;
  undefined8 local_1ca8;
  undefined8 local_1c88;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_18a8;
  int local_180c;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17b8;
  undefined8 local_17b0;
  undefined8 local_17a8;
  undefined4 local_17a0;
  long local_1798;
  undefined4 local_1790;
  undefined4 local_178c;
  undefined4 local_1788;
  undefined4 local_1784;
  undefined4 local_1780;
  undefined8 local_1778;
  long *local_1770;
  undefined8 local_1768;
  undefined8 local_1760;
  undefined8 local_1758;
  undefined4 local_1750;
  long *local_1748;
  undefined4 local_1740;
  undefined4 local_173c;
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined8 local_1728;
  long *local_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  long local_1638;
  long lStack_1630;
  long local_1628;
  long lStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  long local_15e8;
  long lStack_15e0;
  int local_15cc;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  int local_153c;
  undefined8 local_1538;
  undefined8 local_1530;
  undefined8 local_1528;
  undefined4 local_1520;
  long local_1518;
  undefined4 local_1510;
  undefined4 local_150c;
  undefined4 local_1508;
  undefined4 local_1504;
  undefined4 local_1500;
  undefined8 local_14f8;
  long *local_14f0;
  undefined8 local_14e8;
  undefined8 local_14e0;
  undefined8 local_14d8;
  undefined4 local_14d0;
  long *local_14c8;
  undefined4 local_14c0;
  undefined4 local_14bc;
  undefined4 local_14b8;
  undefined4 local_14b4;
  undefined4 local_14b0;
  undefined8 local_14a8;
  long *local_14a0;
  int local_1494;
  undefined8 local_1490;
  undefined8 local_1488;
  undefined8 local_1480;
  undefined4 local_1478;
  long local_1470;
  undefined4 local_1468;
  undefined4 local_1464;
  undefined4 local_1460;
  undefined4 local_145c;
  undefined4 local_1458;
  undefined8 local_1450;
  undefined8 *local_1448;
  int local_1440;
  int local_143c;
  undefined8 local_1438;
  undefined8 local_1430;
  undefined8 local_1428;
  undefined4 local_1420;
  long local_1418;
  undefined4 local_1410;
  undefined4 local_140c;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined8 local_13f8;
  undefined8 *local_13f0;
  int local_13e4;
  undefined8 local_13e0;
  undefined8 local_13d8;
  undefined8 local_13d0;
  undefined4 local_13c8;
  long *local_13c0;
  undefined4 local_13b8;
  undefined4 local_13b4;
  undefined4 local_13b0;
  undefined4 local_13ac;
  undefined4 local_13a8;
  undefined8 local_13a0;
  undefined8 *local_1398;
  int local_138c;
  undefined8 local_1388;
  undefined8 uStack_1380;
  int local_1374;
  undefined8 local_1370;
  undefined8 local_1368;
  undefined8 local_1360;
  undefined4 local_1358;
  long local_1350;
  undefined4 local_1348;
  undefined4 local_1344;
  undefined4 local_1340;
  undefined4 local_133c;
  undefined4 local_1338;
  undefined8 local_1330;
  undefined8 *local_1328;
  int local_131c;
  undefined8 local_1318;
  undefined8 local_1310;
  undefined8 local_1308;
  undefined4 local_1300;
  long *local_12f8;
  undefined4 local_12f0;
  undefined4 local_12ec;
  undefined4 local_12e8;
  undefined4 local_12e4;
  undefined4 local_12e0;
  undefined8 local_12d8;
  undefined8 *local_12d0;
  int local_12c4;
  int local_12c0;
  int local_12bc;
  int local_12b8;
  void *local_12a8;
  int *local_12a0;
  long local_1298;
  undefined4 local_1290;
  long *local_1288;
  undefined4 local_1280;
  int local_127c;
  int local_1278;
  undefined4 local_1274;
  undefined4 local_1270;
  long local_1268;
  int local_1260;
  int local_125c;
  int local_1258;
  int local_1254;
  long *local_1248;
  long *local_1240;
  long *local_1238;
  void **local_1230;
  undefined8 *local_1228;
  undefined8 *local_1218;
  undefined8 *local_1208;
  undefined8 *local_11f8;
  undefined8 *local_11e8;
  undefined8 *local_11d8;
  undefined8 *local_11c8;
  undefined8 *local_11c0;
  undefined8 *local_11b0;
  void **local_11a8;
  int local_1188;
  undefined4 local_1184;
  void **local_1180;
  undefined8 *local_1170;
  undefined8 *local_1150;
  undefined8 *local_1140;
  undefined8 *local_1120;
  undefined8 *local_1100;
  undefined8 *local_10e0;
  undefined8 *local_10c0;
  undefined8 *local_10a0;
  undefined8 *local_1080;
  undefined1 local_1075;
  int local_1074;
  void **local_1070;
  undefined8 *local_1068;
  undefined1 local_1045;
  int local_1044;
  void **local_1040;
  undefined8 *local_1038;
  undefined1 local_1015;
  int local_1014;
  undefined8 *local_1008;
  undefined1 local_fe5;
  int local_fe4;
  void **local_fe0;
  undefined8 *local_fd8;
  undefined1 local_fb5;
  int local_fb4;
  void **local_fb0;
  undefined8 *local_fa8;
  undefined1 local_f85;
  int local_f84;
  undefined8 *local_f78;
  undefined1 local_f55;
  int local_f54;
  undefined8 *local_f48;
  undefined1 local_f25;
  int local_f24;
  undefined8 *local_f18;
  undefined1 local_ef5;
  int local_ef4;
  undefined8 *local_ee8;
  void *local_e00;
  long local_df0;
  undefined4 local_de4;
  long local_de0;
  long local_dd8;
  undefined4 local_dcc;
  int local_dc8;
  int local_dc4;
  undefined8 *local_dc0;
  long local_db8;
  undefined4 local_dac;
  long local_da8;
  long local_da0;
  undefined4 local_d94;
  int local_d90;
  int local_d8c;
  undefined8 *local_d88;
  long local_d80;
  undefined4 local_d74;
  long local_d70;
  long *local_d68;
  undefined4 local_d5c;
  int local_d58;
  int local_d54;
  undefined8 *local_d50;
  long local_d48;
  undefined4 local_d3c;
  long local_d38;
  long *local_d30;
  undefined4 local_d24;
  int local_d20;
  int local_d1c;
  undefined8 *local_d18;
  long *local_d10;
  undefined4 local_d04;
  long local_d00;
  undefined8 *local_cf8;
  undefined4 local_cec;
  int local_ce8;
  int local_ce4;
  undefined8 *local_ce0;
  long *local_cd8;
  undefined4 local_ccc;
  long local_cc8;
  undefined8 *local_cc0;
  undefined4 local_cb4;
  int local_cb0;
  int local_cac;
  undefined8 *local_ca8;
  long local_ca0;
  undefined4 local_c94;
  long local_c90;
  undefined8 *local_c88;
  undefined4 local_c7c;
  int local_c78;
  int local_c74;
  undefined8 *local_c70;
  long *local_c68;
  undefined4 local_c5c;
  long local_c58;
  long *local_c50;
  undefined4 local_c44;
  int local_c40;
  int local_c3c;
  undefined8 *local_c38;
  long *local_c30;
  undefined4 local_c24;
  long local_c20;
  long *local_c18;
  undefined4 local_c0c;
  int local_c08;
  int local_c04;
  undefined8 *local_c00;
  undefined4 local_bf4;
  long local_bf0;
  undefined4 local_be4;
  long local_be0;
  undefined4 local_bd4;
  long local_bd0;
  undefined4 local_bc4;
  long local_bc0;
  undefined4 local_bb4;
  long local_bb0;
  undefined4 local_ba4;
  long local_ba0;
  undefined4 local_b94;
  long local_b90;
  undefined4 local_b84;
  long local_b80;
  undefined4 local_b74;
  long local_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  int local_b48;
  int iStack_b44;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  int local_b28;
  int iStack_b24;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  int local_a48;
  int iStack_a44;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  int local_a28;
  int iStack_a24;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  int local_a08;
  int iStack_a04;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  int local_9e8;
  int iStack_9e4;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  undefined8 *local_8a0;
  long *local_898;
  long *local_890;
  long *local_888;
  long *local_880;
  long *local_878;
  undefined8 *local_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 *local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 *local_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 *local_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  long local_5e8;
  long lStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  long local_5c8;
  long lStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  long local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  long local_588;
  long lStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  long local_568;
  long lStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  long local_548;
  long lStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  long local_528;
  long lStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  long local_508;
  long lStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  long local_4e8;
  long lStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  long local_4c8;
  long lStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  long local_4a8;
  long lStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  undefined8 local_98;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_2c;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  long local_18;
  undefined8 uStack_10;
  long *local_8;
  
  local_1248 = in_RDX;
  local_1240 = in_RSI;
  local_1238 = in_RDI;
  iVar40 = cpu_support_x86_xop();
  if (iVar40 == 0) {
    local_1254 = *(int *)((long)local_1238 + 0x2c);
    local_1258 = (int)local_1238[6];
    local_125c = (int)local_1238[7];
    local_1260 = (int)local_1240[7];
    local_1230 = &local_12a8;
    local_12a8 = (void *)0x0;
    iVar40 = (int)((ulong)in_stack_ffffffffffffe080 >> 0x20);
    local_12a0 = (int *)0x0;
    local_1298 = 0;
    local_1290 = 0;
    local_1288 = (long *)0x0;
    local_1280 = 0;
    local_127c = 0;
    local_1278 = 0;
    local_1274 = 0;
    local_1270 = 0;
    local_1268 = 0;
    _w = (int)((ulong)in_stack_ffffffffffffe098 >> 0x20);
    if (local_1254 < 2) {
      Mat::create(in_stack_ffffffffffffe0a0,_w,(int)in_stack_ffffffffffffe098,
                  in_stack_ffffffffffffe094,in_stack_ffffffffffffe088,iVar40,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffe104,in_stack_ffffffffffffe100));
    }
    else {
      Mat::create(in_stack_ffffffffffffe0a0,_w,(int)in_stack_ffffffffffffe098,
                  in_stack_ffffffffffffe094,in_stack_ffffffffffffe088,iVar40,
                  (Allocator *)CONCAT44(in_stack_ffffffffffffe104,in_stack_ffffffffffffe100));
    }
    local_12bc = local_1254 >> 1;
    for (local_12c0 = 0; local_12c0 < local_12bc; local_12c0 = local_12c0 + 1) {
      local_12c4 = local_12c0 * 2;
      local_fb4 = local_12c4 / 2;
      local_fa8 = &local_1318;
      local_fb0 = &local_12a8;
      local_cf8 = (undefined8 *)((long)local_12a8 + local_1268 * local_fb4 * local_1298);
      local_ce0 = &local_1318;
      local_bb0 = (long)local_127c * (long)local_1278 * local_1298;
      local_8b0 = &local_1318;
      local_1228 = &local_1318;
      local_12f8 = local_1288;
      local_bb4 = 0x10;
      local_ce4 = local_127c;
      local_ce8 = local_1278;
      local_cec = local_1274;
      local_d00 = local_1298;
      local_d04 = local_1290;
      local_d10 = local_1288;
      local_fb5 = 1;
      local_1318 = 0;
      local_1308 = 0;
      local_1300 = 0;
      local_12f0 = 0;
      local_12ec = 0;
      local_12e8 = 0;
      local_12e4 = 0;
      local_12e0 = 0;
      local_12d8 = 0;
      local_1310 = 0;
      local_12d0 = local_cf8;
      for (local_131c = 0; local_131c < local_125c; local_131c = local_131c + 1) {
        local_ee8 = &local_1370;
        local_dc4 = *(int *)((long)local_1238 + 0x2c);
        local_dc8 = (int)local_1238[6];
        local_dcc = *(undefined4 *)((long)local_1238 + 0x34);
        local_dd8 = *local_1238 + local_1238[8] * (long)local_131c * local_1238[2];
        local_de0 = local_1238[2];
        local_de4 = (undefined4)local_1238[3];
        local_df0 = local_1238[4];
        local_dc0 = &local_1370;
        local_b70 = (long)local_dc4 * (long)local_dc8 * local_de0;
        local_8a0 = &local_1370;
        local_1328 = (undefined8 *)(local_dd8 + (long)local_12c4 * 8);
        local_1218 = &local_1370;
        local_b74 = 0x10;
        local_ef4 = local_131c;
        local_ef5 = 1;
        local_1370 = 0;
        local_1360 = 0;
        local_1358 = 0;
        local_1348 = 0;
        local_1344 = 0;
        local_1340 = 0;
        local_133c = 0;
        local_1338 = 0;
        local_1330 = 0;
        local_1368 = 0;
        for (local_1374 = 0; local_1374 < local_1258; local_1374 = local_1374 + 1) {
          local_870 = local_1328;
          local_1388 = *local_1328;
          uStack_1380 = local_1328[1];
          local_7f8 = local_12d0;
          *local_12d0 = local_1388;
          local_12d0[1] = uStack_1380;
          local_12d0 = local_12d0 + 2;
          local_1328 = local_1328 + local_1254;
          local_808 = local_1388;
          uStack_800 = uStack_1380;
        }
        local_10a0 = local_1218;
        local_1350 = local_df0;
      }
      local_1080 = local_1228;
    }
    local_12b8 = local_12bc * 2;
    for (local_138c = local_12b8; local_138c < local_1254; local_138c = local_138c + 1) {
      local_fe4 = local_138c / 2 + local_138c % 2;
      local_fd8 = &local_13e0;
      local_fe0 = &local_12a8;
      local_cc0 = (undefined8 *)((long)local_12a8 + local_1268 * local_fe4 * local_1298);
      local_ca8 = &local_13e0;
      local_bc0 = (long)local_127c * (long)local_1278 * local_1298;
      local_8b8 = &local_13e0;
      local_1208 = &local_13e0;
      local_13c0 = local_1288;
      local_bc4 = 0x10;
      local_cac = local_127c;
      local_cb0 = local_1278;
      local_cb4 = local_1274;
      local_cc8 = local_1298;
      local_ccc = local_1290;
      local_cd8 = local_1288;
      local_fe5 = 1;
      local_13e0 = 0;
      local_13d0 = 0;
      local_13c8 = 0;
      local_13b8 = 0;
      local_13b4 = 0;
      local_13b0 = 0;
      local_13ac = 0;
      local_13a8 = 0;
      local_13a0 = 0;
      local_13d8 = 0;
      local_1398 = local_cc0;
      for (local_13e4 = 0; local_13e4 < local_125c; local_13e4 = local_13e4 + 1) {
        local_f18 = &local_1438;
        local_d8c = *(int *)((long)local_1238 + 0x2c);
        local_d90 = (int)local_1238[6];
        local_d94 = *(undefined4 *)((long)local_1238 + 0x34);
        local_da0 = *local_1238 + local_1238[8] * (long)local_13e4 * local_1238[2];
        local_da8 = local_1238[2];
        local_dac = (undefined4)local_1238[3];
        local_db8 = local_1238[4];
        local_d88 = &local_1438;
        local_b80 = (long)local_d8c * (long)local_d90 * local_da8;
        local_8a8 = &local_1438;
        local_13f0 = (undefined8 *)(local_da0 + (long)local_138c * 8);
        local_11f8 = &local_1438;
        local_b84 = 0x10;
        local_f24 = local_13e4;
        local_f25 = 1;
        local_1438 = 0;
        local_1428 = 0;
        local_1420 = 0;
        local_1410 = 0;
        local_140c = 0;
        local_1408 = 0;
        local_1404 = 0;
        local_1400 = 0;
        local_13f8 = 0;
        local_1430 = 0;
        for (local_143c = 0; local_143c < local_1258; local_143c = local_143c + 1) {
          *local_1398 = *local_13f0;
          local_1398 = local_1398 + 1;
          local_13f0 = local_13f0 + local_1254;
        }
        local_10e0 = local_11f8;
        local_1418 = local_db8;
      }
      local_10c0 = local_1208;
    }
    for (local_1440 = 0; local_1440 < local_1260; local_1440 = local_1440 + 1) {
      local_1008 = &local_1490;
      local_c74 = *(int *)((long)local_1240 + 0x2c);
      local_c78 = (int)local_1240[6];
      local_c7c = *(undefined4 *)((long)local_1240 + 0x34);
      local_c88 = (undefined8 *)(*local_1240 + local_1240[8] * (long)local_1440 * local_1240[2]);
      local_c90 = local_1240[2];
      local_c94 = (undefined4)local_1240[3];
      local_ca0 = local_1240[4];
      local_c70 = &local_1490;
      local_bd0 = (long)local_c74 * (long)local_c78 * local_c90;
      local_7f0 = &local_1490;
      local_11e8 = &local_1490;
      local_bd4 = 0x10;
      local_1014 = local_1440;
      local_1015 = 1;
      local_1490 = 0;
      local_1480 = 0;
      local_1478 = 0;
      local_1468 = 0;
      local_1464 = 0;
      local_1460 = 0;
      local_145c = 0;
      local_1458 = 0;
      local_1450 = 0;
      local_1488 = 0;
      local_1448 = local_c88;
      for (local_1494 = 0; local_1494 + 1 < local_1254; local_1494 = local_1494 + 2) {
        local_1044 = local_1494 / 2;
        local_1038 = &local_14e8;
        local_1040 = &local_12a8;
        local_c50 = (long *)((long)local_12a8 + local_1268 * local_1044 * local_1298);
        local_c38 = &local_14e8;
        local_be0 = (long)local_127c * (long)local_1278 * local_1298;
        local_7e0 = &local_14e8;
        local_11d8 = &local_14e8;
        local_f48 = &local_1538;
        local_d54 = *(int *)((long)local_1248 + 0x2c);
        local_d58 = (int)local_1248[6];
        local_d5c = *(undefined4 *)((long)local_1248 + 0x34);
        local_d68 = (long *)(*local_1248 + local_1248[8] * (long)local_1440 * local_1248[2]);
        local_d70 = local_1248[2];
        local_d74 = (undefined4)local_1248[3];
        local_d80 = local_1248[4];
        local_d50 = &local_1538;
        local_b90 = (long)local_d54 * (long)local_d58 * local_d70;
        local_8c0 = &local_1538;
        local_11c8 = &local_1538;
        local_14b0 = 0;
        local_14b4 = 0;
        local_14b8 = 0;
        local_14bc = 0;
        local_14c8 = local_1288;
        local_14d0 = 0;
        local_14d8 = 0;
        local_14e0 = 0;
        local_14e8 = 0;
        local_b94 = 0x10;
        local_be4 = 0x10;
        local_c3c = local_127c;
        local_c40 = local_1278;
        local_c44 = local_1274;
        local_c58 = local_1298;
        local_c5c = local_1290;
        local_c68 = local_1288;
        local_f54 = local_1440;
        local_f55 = 1;
        local_1045 = 1;
        local_14a8 = 0;
        local_14c0 = 0;
        local_1538 = 0;
        local_1528 = 0;
        local_1520 = 0;
        local_1510 = 0;
        local_150c = 0;
        local_1508 = 0;
        local_1504 = 0;
        local_1500 = 0;
        local_14f8 = 0;
        local_1530 = 0;
        local_153c = local_125c * local_1258;
        local_6c8 = 0;
        uStack_6c0 = 0;
        local_1558 = 0;
        uStack_1550 = 0;
        local_6d8 = 0;
        uStack_6d0 = 0;
        local_1568 = 0;
        uStack_1560 = 0;
        local_6e8 = 0;
        uStack_6e0 = 0;
        local_1578 = 0;
        uStack_1570 = 0;
        local_6f8 = 0;
        uStack_6f0 = 0;
        local_1588 = 0;
        uStack_1580 = 0;
        local_708 = 0;
        uStack_700 = 0;
        local_1598 = 0;
        uStack_1590 = 0;
        local_718 = 0;
        uStack_710 = 0;
        local_15a8 = 0;
        uStack_15a0 = 0;
        local_728 = 0;
        uStack_720 = 0;
        local_15b8 = 0;
        uStack_15b0 = 0;
        local_738 = 0;
        uStack_730 = 0;
        local_15c8 = 0;
        uStack_15c0 = 0;
        local_15cc = 0;
        local_14f0 = local_d68;
        local_14a0 = local_c50;
        while( true ) {
          uVar16 = uStack_8e0;
          uVar15 = local_8e8;
          uVar14 = uStack_900;
          uVar13 = local_908;
          uVar12 = uStack_920;
          uVar11 = local_928;
          uVar10 = uStack_940;
          uVar9 = local_948;
          uVar8 = uStack_960;
          uVar7 = local_968;
          uVar6 = uStack_980;
          uVar5 = local_988;
          uVar4 = uStack_9a0;
          uVar3 = local_9a8;
          uVar2 = uStack_9c0;
          uVar1 = local_9c8;
          local_8e8._0_4_ = (int)local_1558;
          local_8e8._4_4_ = (int)((ulong)local_1558 >> 0x20);
          uStack_8e0._0_4_ = (int)uStack_1550;
          uStack_8e0._4_4_ = (int)((ulong)uStack_1550 >> 0x20);
          local_908._0_4_ = (int)local_1568;
          local_908._4_4_ = (int)((ulong)local_1568 >> 0x20);
          uStack_900._0_4_ = (int)uStack_1560;
          uStack_900._4_4_ = (int)((ulong)uStack_1560 >> 0x20);
          local_928._0_4_ = (int)local_1578;
          local_928._4_4_ = (int)((ulong)local_1578 >> 0x20);
          uStack_920._0_4_ = (int)uStack_1570;
          uStack_920._4_4_ = (int)((ulong)uStack_1570 >> 0x20);
          local_948._0_4_ = (int)local_1588;
          local_948._4_4_ = (int)((ulong)local_1588 >> 0x20);
          uStack_940._0_4_ = (int)uStack_1580;
          uStack_940._4_4_ = (int)((ulong)uStack_1580 >> 0x20);
          local_968._0_4_ = (int)local_1598;
          local_968._4_4_ = (int)((ulong)local_1598 >> 0x20);
          uStack_960._0_4_ = (int)uStack_1590;
          uStack_960._4_4_ = (int)((ulong)uStack_1590 >> 0x20);
          local_988._0_4_ = (int)local_15a8;
          local_988._4_4_ = (int)((ulong)local_15a8 >> 0x20);
          uStack_980._0_4_ = (int)uStack_15a0;
          uStack_980._4_4_ = (int)((ulong)uStack_15a0 >> 0x20);
          local_9a8._0_4_ = (int)local_15b8;
          local_9a8._4_4_ = (int)((ulong)local_15b8 >> 0x20);
          uStack_9a0._0_4_ = (int)uStack_15b0;
          uStack_9a0._4_4_ = (int)((ulong)uStack_15b0 >> 0x20);
          local_9c8._0_4_ = (int)local_15c8;
          local_9c8._4_4_ = (int)((ulong)local_15c8 >> 0x20);
          uStack_9c0._0_4_ = (int)uStack_15c0;
          uStack_9c0._4_4_ = (int)((ulong)uStack_15c0 >> 0x20);
          if (local_153c <= local_15cc) break;
          local_878 = local_14a0;
          local_15e8 = *local_14a0;
          lStack_15e0 = local_14a0[1];
          local_748 = 0;
          uStack_740 = 0;
          local_608 = 0;
          uStack_600 = 0;
          local_618._0_1_ = (char)local_15e8;
          local_618._1_1_ = (char)((ulong)local_15e8 >> 8);
          local_618._2_1_ = (char)((ulong)local_15e8 >> 0x10);
          local_618._3_1_ = (char)((ulong)local_15e8 >> 0x18);
          local_618._4_1_ = (char)((ulong)local_15e8 >> 0x20);
          local_618._5_1_ = (char)((ulong)local_15e8 >> 0x28);
          local_618._6_1_ = (char)((ulong)local_15e8 >> 0x30);
          local_618._7_1_ = (undefined1)((ulong)local_15e8 >> 0x38);
          uStack_610._0_1_ = (char)lStack_15e0;
          uStack_610._1_1_ = (char)((ulong)lStack_15e0 >> 8);
          uStack_610._2_1_ = (char)((ulong)lStack_15e0 >> 0x10);
          uStack_610._3_1_ = (char)((ulong)lStack_15e0 >> 0x18);
          uStack_610._4_1_ = (char)((ulong)lStack_15e0 >> 0x20);
          uStack_610._5_1_ = (char)((ulong)lStack_15e0 >> 0x28);
          uStack_610._6_1_ = (char)((ulong)lStack_15e0 >> 0x30);
          uStack_610._7_1_ = (undefined1)((ulong)lStack_15e0 >> 0x38);
          local_15f8 = CONCAT17(-(local_15e8 < 0),
                                CONCAT16(-(local_618._6_1_ < '\0'),
                                         CONCAT15(-(local_618._5_1_ < '\0'),
                                                  CONCAT14(-(local_618._4_1_ < '\0'),
                                                           CONCAT13(-(local_618._3_1_ < '\0'),
                                                                    CONCAT12(-(local_618._2_1_ <
                                                                              '\0'),CONCAT11(-(
                                                  local_618._1_1_ < '\0'),-((char)local_618 < '\0'))
                                                  ))))));
          uStack_15f0 = CONCAT17(-(lStack_15e0 < 0),
                                 CONCAT16(-(uStack_610._6_1_ < '\0'),
                                          CONCAT15(-(uStack_610._5_1_ < '\0'),
                                                   CONCAT14(-(uStack_610._4_1_ < '\0'),
                                                            CONCAT13(-(uStack_610._3_1_ < '\0'),
                                                                     CONCAT12(-(uStack_610._2_1_ <
                                                                               '\0'),CONCAT11(-(
                                                  uStack_610._1_1_ < '\0'),
                                                  -((char)uStack_610 < '\0'))))))));
          local_1608 = CONCAT17(-(local_618._3_1_ < '\0'),
                                CONCAT16(local_618._3_1_,
                                         CONCAT15(-(local_618._2_1_ < '\0'),
                                                  CONCAT14(local_618._2_1_,
                                                           CONCAT13(-(local_618._1_1_ < '\0'),
                                                                    CONCAT12(local_618._1_1_,
                                                                             CONCAT11(-((char)
                                                  local_618 < '\0'),(char)local_618)))))));
          uStack_1600 = CONCAT17(-(local_15e8 < 0),
                                 CONCAT16(local_618._7_1_,
                                          CONCAT15(-(local_618._6_1_ < '\0'),
                                                   CONCAT14(local_618._6_1_,
                                                            CONCAT13(-(local_618._5_1_ < '\0'),
                                                                     CONCAT12(local_618._5_1_,
                                                                              CONCAT11(-(local_618.
                                                                                         _4_1_ < 
                                                  '\0'),local_618._4_1_)))))));
          local_1618 = CONCAT17(-(uStack_610._3_1_ < '\0'),
                                CONCAT16(uStack_610._3_1_,
                                         CONCAT15(-(uStack_610._2_1_ < '\0'),
                                                  CONCAT14(uStack_610._2_1_,
                                                           CONCAT13(-(uStack_610._1_1_ < '\0'),
                                                                    CONCAT12(uStack_610._1_1_,
                                                                             CONCAT11(-((char)
                                                  uStack_610 < '\0'),(char)uStack_610)))))));
          uStack_1610 = CONCAT17(-(lStack_15e0 < 0),
                                 CONCAT16(uStack_610._7_1_,
                                          CONCAT15(-(uStack_610._6_1_ < '\0'),
                                                   CONCAT14(uStack_610._6_1_,
                                                            CONCAT13(-(uStack_610._5_1_ < '\0'),
                                                                     CONCAT12(uStack_610._5_1_,
                                                                              CONCAT11(-(uStack_610.
                                                                                         _4_1_ < 
                                                  '\0'),uStack_610._4_1_)))))));
          local_880 = local_14f0;
          local_1628 = *local_14f0;
          lStack_1620 = local_14f0[1];
          local_888 = local_14f0 + 2;
          local_1638 = *local_888;
          lStack_1630 = local_14f0[3];
          local_758 = 0;
          uStack_750 = 0;
          local_628 = 0;
          uStack_620 = 0;
          local_638._0_1_ = (char)local_1628;
          local_638._1_1_ = (char)((ulong)local_1628 >> 8);
          local_638._2_1_ = (char)((ulong)local_1628 >> 0x10);
          local_638._3_1_ = (char)((ulong)local_1628 >> 0x18);
          local_638._4_1_ = (char)((ulong)local_1628 >> 0x20);
          local_638._5_1_ = (char)((ulong)local_1628 >> 0x28);
          local_638._6_1_ = (char)((ulong)local_1628 >> 0x30);
          local_638._7_1_ = (undefined1)((ulong)local_1628 >> 0x38);
          uStack_630._0_1_ = (char)lStack_1620;
          uStack_630._1_1_ = (char)((ulong)lStack_1620 >> 8);
          uStack_630._2_1_ = (char)((ulong)lStack_1620 >> 0x10);
          uStack_630._3_1_ = (char)((ulong)lStack_1620 >> 0x18);
          uStack_630._4_1_ = (char)((ulong)lStack_1620 >> 0x20);
          uStack_630._5_1_ = (char)((ulong)lStack_1620 >> 0x28);
          uStack_630._6_1_ = (char)((ulong)lStack_1620 >> 0x30);
          uStack_630._7_1_ = (undefined1)((ulong)lStack_1620 >> 0x38);
          local_1648 = CONCAT17(-(local_1628 < 0),
                                CONCAT16(-(local_638._6_1_ < '\0'),
                                         CONCAT15(-(local_638._5_1_ < '\0'),
                                                  CONCAT14(-(local_638._4_1_ < '\0'),
                                                           CONCAT13(-(local_638._3_1_ < '\0'),
                                                                    CONCAT12(-(local_638._2_1_ <
                                                                              '\0'),CONCAT11(-(
                                                  local_638._1_1_ < '\0'),-((char)local_638 < '\0'))
                                                  ))))));
          uStack_1640 = CONCAT17(-(lStack_1620 < 0),
                                 CONCAT16(-(uStack_630._6_1_ < '\0'),
                                          CONCAT15(-(uStack_630._5_1_ < '\0'),
                                                   CONCAT14(-(uStack_630._4_1_ < '\0'),
                                                            CONCAT13(-(uStack_630._3_1_ < '\0'),
                                                                     CONCAT12(-(uStack_630._2_1_ <
                                                                               '\0'),CONCAT11(-(
                                                  uStack_630._1_1_ < '\0'),
                                                  -((char)uStack_630 < '\0'))))))));
          local_768 = 0;
          uStack_760 = 0;
          local_648 = 0;
          uStack_640 = 0;
          local_658._0_1_ = (char)local_1638;
          local_658._1_1_ = (char)((ulong)local_1638 >> 8);
          local_658._2_1_ = (char)((ulong)local_1638 >> 0x10);
          local_658._3_1_ = (char)((ulong)local_1638 >> 0x18);
          local_658._4_1_ = (char)((ulong)local_1638 >> 0x20);
          local_658._5_1_ = (char)((ulong)local_1638 >> 0x28);
          local_658._6_1_ = (char)((ulong)local_1638 >> 0x30);
          local_658._7_1_ = (undefined1)((ulong)local_1638 >> 0x38);
          uStack_650._0_1_ = (char)lStack_1630;
          uStack_650._1_1_ = (char)((ulong)lStack_1630 >> 8);
          uStack_650._2_1_ = (char)((ulong)lStack_1630 >> 0x10);
          uStack_650._3_1_ = (char)((ulong)lStack_1630 >> 0x18);
          uStack_650._4_1_ = (char)((ulong)lStack_1630 >> 0x20);
          uStack_650._5_1_ = (char)((ulong)lStack_1630 >> 0x28);
          uStack_650._6_1_ = (char)((ulong)lStack_1630 >> 0x30);
          uStack_650._7_1_ = (undefined1)((ulong)lStack_1630 >> 0x38);
          local_1658 = CONCAT17(-(local_1638 < 0),
                                CONCAT16(-(local_658._6_1_ < '\0'),
                                         CONCAT15(-(local_658._5_1_ < '\0'),
                                                  CONCAT14(-(local_658._4_1_ < '\0'),
                                                           CONCAT13(-(local_658._3_1_ < '\0'),
                                                                    CONCAT12(-(local_658._2_1_ <
                                                                              '\0'),CONCAT11(-(
                                                  local_658._1_1_ < '\0'),-((char)local_658 < '\0'))
                                                  ))))));
          uStack_1650 = CONCAT17(-(lStack_1630 < 0),
                                 CONCAT16(-(uStack_650._6_1_ < '\0'),
                                          CONCAT15(-(uStack_650._5_1_ < '\0'),
                                                   CONCAT14(-(uStack_650._4_1_ < '\0'),
                                                            CONCAT13(-(uStack_650._3_1_ < '\0'),
                                                                     CONCAT12(-(uStack_650._2_1_ <
                                                                               '\0'),CONCAT11(-(
                                                  uStack_650._1_1_ < '\0'),
                                                  -((char)uStack_650 < '\0'))))))));
          local_1668 = CONCAT17(-(local_638._3_1_ < '\0'),
                                CONCAT16(local_638._3_1_,
                                         CONCAT15(-(local_638._2_1_ < '\0'),
                                                  CONCAT14(local_638._2_1_,
                                                           CONCAT13(-(local_638._1_1_ < '\0'),
                                                                    CONCAT12(local_638._1_1_,
                                                                             CONCAT11(-((char)
                                                  local_638 < '\0'),(char)local_638)))))));
          uStack_1660 = CONCAT17(-(local_1628 < 0),
                                 CONCAT16(local_638._7_1_,
                                          CONCAT15(-(local_638._6_1_ < '\0'),
                                                   CONCAT14(local_638._6_1_,
                                                            CONCAT13(-(local_638._5_1_ < '\0'),
                                                                     CONCAT12(local_638._5_1_,
                                                                              CONCAT11(-(local_638.
                                                                                         _4_1_ < 
                                                  '\0'),local_638._4_1_)))))));
          local_1678 = CONCAT17(-(uStack_630._3_1_ < '\0'),
                                CONCAT16(uStack_630._3_1_,
                                         CONCAT15(-(uStack_630._2_1_ < '\0'),
                                                  CONCAT14(uStack_630._2_1_,
                                                           CONCAT13(-(uStack_630._1_1_ < '\0'),
                                                                    CONCAT12(uStack_630._1_1_,
                                                                             CONCAT11(-((char)
                                                  uStack_630 < '\0'),(char)uStack_630)))))));
          uStack_1670 = CONCAT17(-(lStack_1620 < 0),
                                 CONCAT16(uStack_630._7_1_,
                                          CONCAT15(-(uStack_630._6_1_ < '\0'),
                                                   CONCAT14(uStack_630._6_1_,
                                                            CONCAT13(-(uStack_630._5_1_ < '\0'),
                                                                     CONCAT12(uStack_630._5_1_,
                                                                              CONCAT11(-(uStack_630.
                                                                                         _4_1_ < 
                                                  '\0'),uStack_630._4_1_)))))));
          local_1688 = CONCAT17(-(local_658._3_1_ < '\0'),
                                CONCAT16(local_658._3_1_,
                                         CONCAT15(-(local_658._2_1_ < '\0'),
                                                  CONCAT14(local_658._2_1_,
                                                           CONCAT13(-(local_658._1_1_ < '\0'),
                                                                    CONCAT12(local_658._1_1_,
                                                                             CONCAT11(-((char)
                                                  local_658 < '\0'),(char)local_658)))))));
          uStack_1680 = CONCAT17(-(local_1638 < 0),
                                 CONCAT16(local_658._7_1_,
                                          CONCAT15(-(local_658._6_1_ < '\0'),
                                                   CONCAT14(local_658._6_1_,
                                                            CONCAT13(-(local_658._5_1_ < '\0'),
                                                                     CONCAT12(local_658._5_1_,
                                                                              CONCAT11(-(local_658.
                                                                                         _4_1_ < 
                                                  '\0'),local_658._4_1_)))))));
          local_1698 = CONCAT17(-(uStack_650._3_1_ < '\0'),
                                CONCAT16(uStack_650._3_1_,
                                         CONCAT15(-(uStack_650._2_1_ < '\0'),
                                                  CONCAT14(uStack_650._2_1_,
                                                           CONCAT13(-(uStack_650._1_1_ < '\0'),
                                                                    CONCAT12(uStack_650._1_1_,
                                                                             CONCAT11(-((char)
                                                  uStack_650 < '\0'),(char)uStack_650)))))));
          uStack_1690 = CONCAT17(-(lStack_1630 < 0),
                                 CONCAT16(uStack_650._7_1_,
                                          CONCAT15(-(uStack_650._6_1_ < '\0'),
                                                   CONCAT14(uStack_650._6_1_,
                                                            CONCAT13(-(uStack_650._5_1_ < '\0'),
                                                                     CONCAT12(uStack_650._5_1_,
                                                                              CONCAT11(-(uStack_650.
                                                                                         _4_1_ < 
                                                  '\0'),uStack_650._4_1_)))))));
          auVar39._8_8_ = uStack_1600;
          auVar39._0_8_ = local_1608;
          auVar38._8_8_ = uStack_1660;
          auVar38._0_8_ = local_1668;
          auVar41 = pmaddwd(auVar39,auVar38);
          local_1bb8 = auVar41._0_8_;
          uStack_1bb0 = auVar41._8_8_;
          uVar1 = local_1558;
          uVar2 = uStack_1550;
          local_8d8._0_4_ = auVar41._0_4_;
          local_8d8._4_4_ = auVar41._4_4_;
          uStack_8d0._0_4_ = auVar41._8_4_;
          uStack_8d0._4_4_ = auVar41._12_4_;
          local_1558 = CONCAT44(local_8d8._4_4_ + local_8e8._4_4_,(int)local_8d8 + (int)local_8e8);
          uStack_1550 = CONCAT44(uStack_8d0._4_4_ + uStack_8e0._4_4_,
                                 (int)uStack_8d0 + (int)uStack_8e0);
          auVar37._8_8_ = uStack_1600;
          auVar37._0_8_ = local_1608;
          auVar36._8_8_ = uStack_1670;
          auVar36._0_8_ = local_1678;
          auVar41 = pmaddwd(auVar37,auVar36);
          local_1bc8 = auVar41._0_8_;
          uStack_1bc0 = auVar41._8_8_;
          uVar3 = local_1568;
          uVar4 = uStack_1560;
          local_8f8._0_4_ = auVar41._0_4_;
          local_8f8._4_4_ = auVar41._4_4_;
          uStack_8f0._0_4_ = auVar41._8_4_;
          uStack_8f0._4_4_ = auVar41._12_4_;
          local_1568 = CONCAT44(local_8f8._4_4_ + local_908._4_4_,(int)local_8f8 + (int)local_908);
          uStack_1560 = CONCAT44(uStack_8f0._4_4_ + uStack_900._4_4_,
                                 (int)uStack_8f0 + (int)uStack_900);
          auVar35._8_8_ = uStack_1600;
          auVar35._0_8_ = local_1608;
          auVar34._8_8_ = uStack_1680;
          auVar34._0_8_ = local_1688;
          auVar41 = pmaddwd(auVar35,auVar34);
          local_1bd8 = auVar41._0_8_;
          uStack_1bd0 = auVar41._8_8_;
          uVar5 = local_1578;
          uVar6 = uStack_1570;
          local_918._0_4_ = auVar41._0_4_;
          local_918._4_4_ = auVar41._4_4_;
          uStack_910._0_4_ = auVar41._8_4_;
          uStack_910._4_4_ = auVar41._12_4_;
          local_1578 = CONCAT44(local_918._4_4_ + local_928._4_4_,(int)local_918 + (int)local_928);
          uStack_1570 = CONCAT44(uStack_910._4_4_ + uStack_920._4_4_,
                                 (int)uStack_910 + (int)uStack_920);
          auVar33._8_8_ = uStack_1600;
          auVar33._0_8_ = local_1608;
          auVar32._8_8_ = uStack_1690;
          auVar32._0_8_ = local_1698;
          auVar41 = pmaddwd(auVar33,auVar32);
          local_1be8 = auVar41._0_8_;
          uStack_1be0 = auVar41._8_8_;
          uVar7 = local_1588;
          uVar8 = uStack_1580;
          local_938._0_4_ = auVar41._0_4_;
          local_938._4_4_ = auVar41._4_4_;
          uStack_930._0_4_ = auVar41._8_4_;
          uStack_930._4_4_ = auVar41._12_4_;
          local_1588 = CONCAT44(local_938._4_4_ + local_948._4_4_,(int)local_938 + (int)local_948);
          uStack_1580 = CONCAT44(uStack_930._4_4_ + uStack_940._4_4_,
                                 (int)uStack_930 + (int)uStack_940);
          auVar31._8_8_ = uStack_1610;
          auVar31._0_8_ = local_1618;
          auVar30._8_8_ = uStack_1660;
          auVar30._0_8_ = local_1668;
          auVar41 = pmaddwd(auVar31,auVar30);
          local_1bf8 = auVar41._0_8_;
          uStack_1bf0 = auVar41._8_8_;
          uVar9 = local_1598;
          uVar10 = uStack_1590;
          local_958._0_4_ = auVar41._0_4_;
          local_958._4_4_ = auVar41._4_4_;
          uStack_950._0_4_ = auVar41._8_4_;
          uStack_950._4_4_ = auVar41._12_4_;
          local_1598 = CONCAT44(local_958._4_4_ + local_968._4_4_,(int)local_958 + (int)local_968);
          uStack_1590 = CONCAT44(uStack_950._4_4_ + uStack_960._4_4_,
                                 (int)uStack_950 + (int)uStack_960);
          auVar29._8_8_ = uStack_1610;
          auVar29._0_8_ = local_1618;
          auVar28._8_8_ = uStack_1670;
          auVar28._0_8_ = local_1678;
          auVar41 = pmaddwd(auVar29,auVar28);
          local_1c08 = auVar41._0_8_;
          uStack_1c00 = auVar41._8_8_;
          uVar11 = local_15a8;
          uVar12 = uStack_15a0;
          local_978._0_4_ = auVar41._0_4_;
          local_978._4_4_ = auVar41._4_4_;
          uStack_970._0_4_ = auVar41._8_4_;
          uStack_970._4_4_ = auVar41._12_4_;
          local_15a8 = CONCAT44(local_978._4_4_ + local_988._4_4_,(int)local_978 + (int)local_988);
          uStack_15a0 = CONCAT44(uStack_970._4_4_ + uStack_980._4_4_,
                                 (int)uStack_970 + (int)uStack_980);
          auVar27._8_8_ = uStack_1610;
          auVar27._0_8_ = local_1618;
          auVar26._8_8_ = uStack_1680;
          auVar26._0_8_ = local_1688;
          auVar41 = pmaddwd(auVar27,auVar26);
          local_1c18 = auVar41._0_8_;
          uStack_1c10 = auVar41._8_8_;
          uVar13 = local_15b8;
          uVar14 = uStack_15b0;
          local_998._0_4_ = auVar41._0_4_;
          local_998._4_4_ = auVar41._4_4_;
          uStack_990._0_4_ = auVar41._8_4_;
          uStack_990._4_4_ = auVar41._12_4_;
          local_15b8 = CONCAT44(local_998._4_4_ + local_9a8._4_4_,(int)local_998 + (int)local_9a8);
          uStack_15b0 = CONCAT44(uStack_990._4_4_ + uStack_9a0._4_4_,
                                 (int)uStack_990 + (int)uStack_9a0);
          auVar25._8_8_ = uStack_1610;
          auVar25._0_8_ = local_1618;
          auVar41._8_8_ = uStack_1690;
          auVar41._0_8_ = local_1698;
          auVar41 = pmaddwd(auVar25,auVar41);
          local_1c28 = auVar41._0_8_;
          uStack_1c20 = auVar41._8_8_;
          uVar15 = local_15c8;
          uVar16 = uStack_15c0;
          local_9b8._0_4_ = auVar41._0_4_;
          local_9b8._4_4_ = auVar41._4_4_;
          uStack_9b0._0_4_ = auVar41._8_4_;
          uStack_9b0._4_4_ = auVar41._12_4_;
          local_15c8 = CONCAT44(local_9b8._4_4_ + local_9c8._4_4_,(int)local_9b8 + (int)local_9c8);
          uStack_15c0 = CONCAT44(uStack_9b0._4_4_ + uStack_9c0._4_4_,
                                 (int)uStack_9b0 + (int)uStack_9c0);
          local_14a0 = local_14a0 + 2;
          local_14f0 = local_14f0 + 4;
          local_15cc = local_15cc + 1;
          local_9c8 = uVar15;
          uStack_9c0 = uVar16;
          local_9b8 = local_1c28;
          uStack_9b0 = uStack_1c20;
          local_9a8 = uVar13;
          uStack_9a0 = uVar14;
          local_998 = local_1c18;
          uStack_990 = uStack_1c10;
          local_988 = uVar11;
          uStack_980 = uVar12;
          local_978 = local_1c08;
          uStack_970 = uStack_1c00;
          local_968 = uVar9;
          uStack_960 = uVar10;
          local_958 = local_1bf8;
          uStack_950 = uStack_1bf0;
          local_948 = uVar7;
          uStack_940 = uVar8;
          local_938 = local_1be8;
          uStack_930 = uStack_1be0;
          local_928 = uVar5;
          uStack_920 = uVar6;
          local_918 = local_1bd8;
          uStack_910 = uStack_1bd0;
          local_908 = uVar3;
          uStack_900 = uVar4;
          local_8f8 = local_1bc8;
          uStack_8f0 = uStack_1bc0;
          local_8e8 = uVar1;
          uStack_8e0 = uVar2;
          local_8d8 = local_1bb8;
          uStack_8d0 = uStack_1bb0;
          local_658 = local_1638;
          uStack_650 = lStack_1630;
          local_638 = local_1628;
          uStack_630 = lStack_1620;
          local_618 = local_15e8;
          uStack_610 = lStack_15e0;
          local_598 = local_1658;
          uStack_590 = uStack_1650;
          local_588 = local_1638;
          lStack_580 = lStack_1630;
          local_578 = local_1648;
          uStack_570 = uStack_1640;
          local_568 = local_1628;
          lStack_560 = lStack_1620;
          local_558 = local_15f8;
          uStack_550 = uStack_15f0;
          local_548 = local_15e8;
          lStack_540 = lStack_15e0;
          local_4f8 = local_1658;
          uStack_4f0 = uStack_1650;
          local_4e8 = local_1638;
          lStack_4e0 = lStack_1630;
          local_4d8 = local_1648;
          uStack_4d0 = uStack_1640;
          local_4c8 = local_1628;
          lStack_4c0 = lStack_1620;
          local_4b8 = local_15f8;
          uStack_4b0 = uStack_15f0;
          local_4a8 = local_15e8;
          lStack_4a0 = lStack_15e0;
          local_418 = local_1698;
          uStack_410 = uStack_1690;
          local_408 = local_1618;
          uStack_400 = uStack_1610;
          local_3f8 = local_1688;
          uStack_3f0 = uStack_1680;
          local_3e8 = local_1618;
          uStack_3e0 = uStack_1610;
          local_3d8 = local_1678;
          uStack_3d0 = uStack_1670;
          local_3c8 = local_1618;
          uStack_3c0 = uStack_1610;
          local_3b8 = local_1668;
          uStack_3b0 = uStack_1660;
          local_3a8 = local_1618;
          uStack_3a0 = uStack_1610;
          local_398 = local_1698;
          uStack_390 = uStack_1690;
          local_388 = local_1608;
          uStack_380 = uStack_1600;
          local_378 = local_1688;
          uStack_370 = uStack_1680;
          local_368 = local_1608;
          uStack_360 = uStack_1600;
          local_358 = local_1678;
          uStack_350 = uStack_1670;
          local_348 = local_1608;
          uStack_340 = uStack_1600;
          local_338 = local_1668;
          uStack_330 = uStack_1660;
          local_328 = local_1608;
          uStack_320 = uStack_1600;
        }
        local_268 = local_1558;
        uStack_260 = uStack_1550;
        local_278 = local_1568;
        uStack_270 = uStack_1560;
        local_16a8 = CONCAT44((int)local_908,(int)local_8e8);
        uStack_16a0 = CONCAT44(local_908._4_4_,local_8e8._4_4_);
        local_288 = local_1578;
        uStack_280 = uStack_1570;
        local_298 = local_1588;
        uStack_290 = uStack_1580;
        local_16b8 = CONCAT44((int)local_948,(int)local_928);
        uStack_16b0 = CONCAT44(local_948._4_4_,local_928._4_4_);
        local_1a8 = local_1558;
        uStack_1a0 = uStack_1550;
        local_1b8 = local_1568;
        uStack_1b0 = uStack_1560;
        local_16c8 = CONCAT44((int)uStack_900,(int)uStack_8e0);
        uStack_16c0 = CONCAT44(uStack_900._4_4_,uStack_8e0._4_4_);
        local_1c8 = local_1578;
        uStack_1c0 = uStack_1570;
        local_1d8 = local_1588;
        uStack_1d0 = uStack_1580;
        local_16d8 = CONCAT44((int)uStack_940,(int)uStack_920);
        uStack_16d0 = CONCAT44(uStack_940._4_4_,uStack_920._4_4_);
        iStack_1c = local_908._4_4_;
        iStack_2c = local_948._4_4_;
        local_18 = CONCAT44(local_18._4_4_,(undefined4)local_1698);
        _local_28 = CONCAT44((int)local_908,(int)local_8e8);
        uStack_1560 = CONCAT44(local_908._4_4_,iStack_20);
        iStack_3c = uStack_900._4_4_;
        iStack_4c = uStack_940._4_4_;
        _local_38 = CONCAT44((int)local_948,(int)local_928);
        _local_48 = CONCAT44((int)uStack_900,(int)uStack_8e0);
        uStack_1580 = CONCAT44(uStack_900._4_4_,iStack_40);
        local_2a8 = local_1598;
        uStack_2a0 = uStack_1590;
        local_2b8 = local_15a8;
        uStack_2b0 = uStack_15a0;
        local_16e8 = CONCAT44((int)local_988,(int)local_968);
        uStack_16e0 = CONCAT44(local_988._4_4_,local_968._4_4_);
        local_2c8 = local_15b8;
        uStack_2c0 = uStack_15b0;
        local_2d8 = local_15c8;
        uStack_2d0 = uStack_15c0;
        local_16f8 = CONCAT44((int)local_9c8,(int)local_9a8);
        uStack_16f0 = CONCAT44(local_9c8._4_4_,local_9a8._4_4_);
        local_1e8 = local_1598;
        uStack_1e0 = uStack_1590;
        local_1f8 = local_15a8;
        uStack_1f0 = uStack_15a0;
        local_1708 = CONCAT44((int)uStack_980,(int)uStack_960);
        uStack_1700 = CONCAT44(uStack_980._4_4_,uStack_960._4_4_);
        local_208 = local_15b8;
        uStack_200 = uStack_15b0;
        local_218 = local_15c8;
        uStack_210 = uStack_15c0;
        local_1718 = CONCAT44((int)uStack_9c0,(int)uStack_9a0);
        uStack_1710 = CONCAT44(uStack_9c0._4_4_,uStack_9a0._4_4_);
        iStack_5c = local_988._4_4_;
        iStack_6c = local_9c8._4_4_;
        _local_58 = CONCAT44((int)uStack_940,(int)uStack_920);
        _local_68 = CONCAT44((int)local_988,(int)local_968);
        uStack_15a0 = CONCAT44(local_988._4_4_,iStack_60);
        iStack_7c = uStack_980._4_4_;
        iStack_8c = uStack_9c0._4_4_;
        _local_78 = CONCAT44((int)local_9c8,(int)local_9a8);
        _local_88 = CONCAT44((int)uStack_980,(int)uStack_960);
        uStack_15c0 = CONCAT44(uStack_980._4_4_,iStack_80);
        local_9e8 = (int)local_1c88;
        iStack_9e4 = (int)((ulong)local_1c88 >> 0x20);
        local_1558 = CONCAT44((int)local_908 + iStack_9e4,(int)local_8e8 + local_9e8);
        uStack_1550 = CONCAT44((int)local_948 + local_908._4_4_,(int)local_928 + iStack_20);
        local_a08 = (int)local_1ca8;
        iStack_a04 = (int)((ulong)local_1ca8 >> 0x20);
        local_1578 = CONCAT44((int)uStack_900 + iStack_a04,(int)uStack_8e0 + local_a08);
        uStack_1570 = CONCAT44((int)uStack_940 + uStack_900._4_4_,(int)uStack_920 + iStack_40);
        local_a28 = (int)local_1d08;
        iStack_a24 = (int)((ulong)local_1d08 >> 0x20);
        local_1598 = CONCAT44((int)local_988 + iStack_a24,(int)local_968 + local_a28);
        uStack_1590 = CONCAT44((int)local_9c8 + local_988._4_4_,(int)local_9a8 + iStack_60);
        local_a48 = (int)local_1d28;
        iStack_a44 = (int)((ulong)local_1d28 >> 0x20);
        local_15b8 = CONCAT44((int)uStack_980 + iStack_a44,(int)uStack_960 + local_a48);
        uStack_15b0 = CONCAT44((int)uStack_9c0 + uStack_980._4_4_,(int)uStack_9a0 + iStack_80);
        local_a58 = local_1558;
        uStack_a50 = uStack_1550;
        local_a68 = local_1578;
        uStack_a60 = uStack_1570;
        local_1558 = CONCAT44((int)local_908 + iStack_9e4 + (int)uStack_900 + iStack_a04,
                              (int)local_8e8 + local_9e8 + (int)uStack_8e0 + local_a08);
        uStack_1550 = CONCAT44((int)local_948 + local_908._4_4_ + (int)uStack_940 + uStack_900._4_4_
                               ,(int)local_928 + iStack_20 + (int)uStack_920 + iStack_40);
        local_a78 = local_1598;
        uStack_a70 = uStack_1590;
        local_a88 = local_15b8;
        uStack_a80 = uStack_15b0;
        local_1598 = CONCAT44((int)local_988 + iStack_a24 + (int)uStack_980 + iStack_a44,
                              (int)local_968 + local_a28 + (int)uStack_960 + local_a48);
        uStack_1590 = CONCAT44((int)local_9c8 + local_988._4_4_ + (int)uStack_9c0 + uStack_980._4_4_
                               ,(int)local_9a8 + iStack_60 + (int)uStack_9a0 + iStack_80);
        local_810 = local_1448;
        local_828 = local_1558;
        uStack_820 = uStack_1550;
        *local_1448 = local_1558;
        local_1448[1] = uStack_1550;
        local_830 = local_1448 + 2;
        local_848 = local_1598;
        uStack_840 = uStack_1590;
        *local_830 = local_1598;
        local_1448[3] = uStack_1590;
        local_1448 = local_1448 + 4;
        local_1140 = local_11c8;
        local_1120 = local_11d8;
        uStack_a40 = uStack_15c0;
        local_a38 = local_1708;
        uStack_a30 = local_1718;
        uStack_a20 = uStack_15a0;
        local_a18 = local_16e8;
        uStack_a10 = local_16f8;
        uStack_a00 = uStack_1580;
        local_9f8 = local_16c8;
        uStack_9f0 = local_16d8;
        uStack_9e0 = uStack_1560;
        local_9d8 = local_16a8;
        uStack_9d0 = local_16b8;
        local_9c8 = uVar1;
        uStack_9c0 = uVar2;
        local_9a8 = uVar3;
        uStack_9a0 = uVar4;
        local_988 = uVar5;
        uStack_980 = uVar6;
        local_968 = uVar7;
        uStack_960 = uVar8;
        local_948 = uVar9;
        uStack_940 = uVar10;
        local_928 = uVar11;
        uStack_920 = uVar12;
        local_908 = uVar13;
        uStack_900 = uVar14;
        local_8e8 = uVar15;
        uStack_8e0 = uVar16;
        local_158 = local_1718;
        uStack_150 = uStack_1710;
        local_148 = local_1708;
        uStack_140 = uStack_1700;
        local_138 = local_16f8;
        uStack_130 = uStack_16f0;
        local_128 = local_16e8;
        uStack_120 = uStack_16e0;
        local_118 = local_16d8;
        uStack_110 = uStack_16d0;
        local_108 = local_16c8;
        uStack_100 = uStack_16c0;
        local_f8 = local_16b8;
        uStack_f0 = uStack_16b0;
        local_e8 = local_16a8;
        uStack_e0 = uStack_16a0;
        local_98 = local_1718;
        local_1518 = local_d80;
      }
      for (; local_1494 < local_1254; local_1494 = local_1494 + 1) {
        local_1074 = local_1494 / 2 + local_1494 % 2;
        local_1068 = &local_1768;
        local_1070 = &local_12a8;
        local_c18 = (long *)((long)local_12a8 + local_1268 * local_1074 * local_1298);
        local_c00 = &local_1768;
        local_bf0 = (long)local_127c * (long)local_1278 * local_1298;
        local_7e8 = &local_1768;
        local_11c0 = &local_1768;
        local_f78 = &local_17b8;
        local_d1c = *(int *)((long)local_1248 + 0x2c);
        local_d20 = (int)local_1248[6];
        local_d24 = *(undefined4 *)((long)local_1248 + 0x34);
        local_d30 = (long *)(*local_1248 + local_1248[8] * (long)local_1440 * local_1248[2]);
        local_d38 = local_1248[2];
        local_d3c = (undefined4)local_1248[3];
        local_d48 = local_1248[4];
        local_d18 = &local_17b8;
        local_ba0 = (long)local_d1c * (long)local_d20 * local_d38;
        local_1730 = 0;
        local_1734 = 0;
        local_1738 = 0;
        local_173c = 0;
        local_1748 = local_1288;
        local_1750 = 0;
        local_1758 = 0;
        local_1760 = 0;
        local_1768 = 0;
        local_ba4 = 0x10;
        local_bf4 = 0x10;
        local_c04 = local_127c;
        local_c08 = local_1278;
        local_c0c = local_1274;
        local_c20 = local_1298;
        local_c24 = local_1290;
        local_c30 = local_1288;
        local_f84 = local_1440;
        local_f85 = 1;
        local_1075 = 1;
        local_1728 = 0;
        local_1740 = 0;
        local_8c8 = &local_17b8;
        local_11b0 = &local_17b8;
        local_17b8 = 0;
        local_17a8 = 0;
        local_17a0 = 0;
        local_1790 = 0;
        local_178c = 0;
        local_1788 = 0;
        local_1784 = 0;
        local_1780 = 0;
        local_1778 = 0;
        local_17b0 = 0;
        local_778 = 0;
        uStack_770 = 0;
        local_17d8 = 0;
        uStack_17d0 = 0;
        local_788 = 0;
        uStack_780 = 0;
        local_17e8 = 0;
        uStack_17e0 = 0;
        local_798 = 0;
        uStack_790 = 0;
        local_17f8 = 0;
        uStack_17f0 = 0;
        local_7a8 = 0;
        uStack_7a0 = 0;
        local_1808 = 0;
        uStack_1800 = 0;
        local_180c = 0;
        local_1770 = local_d30;
        local_1720 = local_c18;
        while( true ) {
          uVar8 = uStack_aa0;
          uVar7 = local_aa8;
          uVar6 = uStack_ac0;
          uVar5 = local_ac8;
          uVar4 = uStack_ae0;
          uVar3 = local_ae8;
          uVar2 = uStack_b00;
          uVar1 = local_b08;
          local_aa8._0_4_ = (int)local_17d8;
          local_aa8._4_4_ = (int)((ulong)local_17d8 >> 0x20);
          uStack_aa0._0_4_ = (int)uStack_17d0;
          uStack_aa0._4_4_ = (int)((ulong)uStack_17d0 >> 0x20);
          local_ac8._0_4_ = (int)local_17e8;
          local_ac8._4_4_ = (int)((ulong)local_17e8 >> 0x20);
          uStack_ac0._0_4_ = (int)uStack_17e0;
          uStack_ac0._4_4_ = (int)((ulong)uStack_17e0 >> 0x20);
          local_ae8._0_4_ = (int)local_17f8;
          local_ae8._4_4_ = (int)((ulong)local_17f8 >> 0x20);
          uStack_ae0._0_4_ = (int)uStack_17f0;
          uStack_ae0._4_4_ = (int)((ulong)uStack_17f0 >> 0x20);
          local_b08._0_4_ = (int)local_1808;
          local_b08._4_4_ = (int)((ulong)local_1808 >> 0x20);
          uStack_b00._0_4_ = (int)uStack_1800;
          uStack_b00._4_4_ = (int)((ulong)uStack_1800 >> 0x20);
          if (local_125c * local_1258 <= local_180c) break;
          local_8 = local_1720;
          local_5a8 = *local_1720;
          uStack_10 = 0;
          local_7b8 = 0;
          uStack_7b0 = 0;
          local_668 = 0;
          uStack_660 = 0;
          uStack_670 = 0;
          local_678._0_1_ = (char)local_5a8;
          local_678._1_1_ = (char)((ulong)local_5a8 >> 8);
          local_678._2_1_ = (char)((ulong)local_5a8 >> 0x10);
          local_678._3_1_ = (char)((ulong)local_5a8 >> 0x18);
          local_678._4_1_ = (char)((ulong)local_5a8 >> 0x20);
          local_678._5_1_ = (char)((ulong)local_5a8 >> 0x28);
          local_678._6_1_ = (char)((ulong)local_5a8 >> 0x30);
          local_678._7_1_ = (undefined1)((ulong)local_5a8 >> 0x38);
          local_5b8 = CONCAT17(-(local_5a8 < 0),
                               CONCAT16(-(local_678._6_1_ < '\0'),
                                        CONCAT15(-(local_678._5_1_ < '\0'),
                                                 CONCAT14(-(local_678._4_1_ < '\0'),
                                                          CONCAT13(-(local_678._3_1_ < '\0'),
                                                                   CONCAT12(-(local_678._2_1_ < '\0'
                                                                             ),CONCAT11(-(local_678.
                                                                                          _1_1_ < 
                                                  '\0'),-((char)local_678 < '\0'))))))));
          uStack_5b0 = 0;
          uStack_5a0 = 0;
          local_488 = CONCAT17(-(local_678._3_1_ < '\0'),
                               CONCAT16(local_678._3_1_,
                                        CONCAT15(-(local_678._2_1_ < '\0'),
                                                 CONCAT14(local_678._2_1_,
                                                          CONCAT13(-(local_678._1_1_ < '\0'),
                                                                   CONCAT12(local_678._1_1_,
                                                                            CONCAT11(-((char)
                                                  local_678 < '\0'),(char)local_678)))))));
          uStack_480 = CONCAT17(-(local_5a8 < 0),
                                CONCAT16(local_678._7_1_,
                                         CONCAT15(-(local_678._6_1_ < '\0'),
                                                  CONCAT14(local_678._6_1_,
                                                           CONCAT13(-(local_678._5_1_ < '\0'),
                                                                    CONCAT12(local_678._5_1_,
                                                                             CONCAT11(-(local_678.
                                                                                        _4_1_ < '\0'
                                                                                       ),local_678.
                                                                                         _4_1_))))))
                               );
          local_890 = local_1770;
          local_5c8 = *local_1770;
          lStack_5c0 = local_1770[1];
          local_898 = local_1770 + 2;
          local_5e8 = *local_898;
          lStack_5e0 = local_1770[3];
          local_7c8 = 0;
          uStack_7c0 = 0;
          local_688 = 0;
          uStack_680 = 0;
          local_698._0_1_ = (char)local_5c8;
          local_698._1_1_ = (char)((ulong)local_5c8 >> 8);
          local_698._2_1_ = (char)((ulong)local_5c8 >> 0x10);
          local_698._3_1_ = (char)((ulong)local_5c8 >> 0x18);
          local_698._4_1_ = (char)((ulong)local_5c8 >> 0x20);
          local_698._5_1_ = (char)((ulong)local_5c8 >> 0x28);
          local_698._6_1_ = (char)((ulong)local_5c8 >> 0x30);
          local_698._7_1_ = (undefined1)((ulong)local_5c8 >> 0x38);
          uStack_690._0_1_ = (char)lStack_5c0;
          uStack_690._1_1_ = (char)((ulong)lStack_5c0 >> 8);
          uStack_690._2_1_ = (char)((ulong)lStack_5c0 >> 0x10);
          uStack_690._3_1_ = (char)((ulong)lStack_5c0 >> 0x18);
          uStack_690._4_1_ = (char)((ulong)lStack_5c0 >> 0x20);
          uStack_690._5_1_ = (char)((ulong)lStack_5c0 >> 0x28);
          uStack_690._6_1_ = (char)((ulong)lStack_5c0 >> 0x30);
          uStack_690._7_1_ = (undefined1)((ulong)lStack_5c0 >> 0x38);
          local_5d8 = CONCAT17(-(local_5c8 < 0),
                               CONCAT16(-(local_698._6_1_ < '\0'),
                                        CONCAT15(-(local_698._5_1_ < '\0'),
                                                 CONCAT14(-(local_698._4_1_ < '\0'),
                                                          CONCAT13(-(local_698._3_1_ < '\0'),
                                                                   CONCAT12(-(local_698._2_1_ < '\0'
                                                                             ),CONCAT11(-(local_698.
                                                                                          _1_1_ < 
                                                  '\0'),-((char)local_698 < '\0'))))))));
          uStack_5d0 = CONCAT17(-(lStack_5c0 < 0),
                                CONCAT16(-(uStack_690._6_1_ < '\0'),
                                         CONCAT15(-(uStack_690._5_1_ < '\0'),
                                                  CONCAT14(-(uStack_690._4_1_ < '\0'),
                                                           CONCAT13(-(uStack_690._3_1_ < '\0'),
                                                                    CONCAT12(-(uStack_690._2_1_ <
                                                                              '\0'),CONCAT11(-(
                                                  uStack_690._1_1_ < '\0'),
                                                  -((char)uStack_690 < '\0'))))))));
          local_7d8 = 0;
          uStack_7d0 = 0;
          local_6a8 = 0;
          uStack_6a0 = 0;
          local_6b8._0_1_ = (char)local_5e8;
          local_6b8._1_1_ = (char)((ulong)local_5e8 >> 8);
          local_6b8._2_1_ = (char)((ulong)local_5e8 >> 0x10);
          local_6b8._3_1_ = (char)((ulong)local_5e8 >> 0x18);
          local_6b8._4_1_ = (char)((ulong)local_5e8 >> 0x20);
          local_6b8._5_1_ = (char)((ulong)local_5e8 >> 0x28);
          local_6b8._6_1_ = (char)((ulong)local_5e8 >> 0x30);
          local_6b8._7_1_ = (undefined1)((ulong)local_5e8 >> 0x38);
          uStack_6b0._0_1_ = (char)lStack_5e0;
          uStack_6b0._1_1_ = (char)((ulong)lStack_5e0 >> 8);
          uStack_6b0._2_1_ = (char)((ulong)lStack_5e0 >> 0x10);
          uStack_6b0._3_1_ = (char)((ulong)lStack_5e0 >> 0x18);
          uStack_6b0._4_1_ = (char)((ulong)lStack_5e0 >> 0x20);
          uStack_6b0._5_1_ = (char)((ulong)lStack_5e0 >> 0x28);
          uStack_6b0._6_1_ = (char)((ulong)lStack_5e0 >> 0x30);
          uStack_6b0._7_1_ = (undefined1)((ulong)lStack_5e0 >> 0x38);
          local_5f8 = CONCAT17(-(local_5e8 < 0),
                               CONCAT16(-(local_6b8._6_1_ < '\0'),
                                        CONCAT15(-(local_6b8._5_1_ < '\0'),
                                                 CONCAT14(-(local_6b8._4_1_ < '\0'),
                                                          CONCAT13(-(local_6b8._3_1_ < '\0'),
                                                                   CONCAT12(-(local_6b8._2_1_ < '\0'
                                                                             ),CONCAT11(-(local_6b8.
                                                                                          _1_1_ < 
                                                  '\0'),-((char)local_6b8 < '\0'))))))));
          uStack_5f0 = CONCAT17(-(lStack_5e0 < 0),
                                CONCAT16(-(uStack_6b0._6_1_ < '\0'),
                                         CONCAT15(-(uStack_6b0._5_1_ < '\0'),
                                                  CONCAT14(-(uStack_6b0._4_1_ < '\0'),
                                                           CONCAT13(-(uStack_6b0._3_1_ < '\0'),
                                                                    CONCAT12(-(uStack_6b0._2_1_ <
                                                                              '\0'),CONCAT11(-(
                                                  uStack_6b0._1_1_ < '\0'),
                                                  -((char)uStack_6b0 < '\0'))))))));
          local_438 = CONCAT17(-(local_698._3_1_ < '\0'),
                               CONCAT16(local_698._3_1_,
                                        CONCAT15(-(local_698._2_1_ < '\0'),
                                                 CONCAT14(local_698._2_1_,
                                                          CONCAT13(-(local_698._1_1_ < '\0'),
                                                                   CONCAT12(local_698._1_1_,
                                                                            CONCAT11(-((char)
                                                  local_698 < '\0'),(char)local_698)))))));
          uStack_430 = CONCAT17(-(local_5c8 < 0),
                                CONCAT16(local_698._7_1_,
                                         CONCAT15(-(local_698._6_1_ < '\0'),
                                                  CONCAT14(local_698._6_1_,
                                                           CONCAT13(-(local_698._5_1_ < '\0'),
                                                                    CONCAT12(local_698._5_1_,
                                                                             CONCAT11(-(local_698.
                                                                                        _4_1_ < '\0'
                                                                                       ),local_698.
                                                                                         _4_1_))))))
                               );
          local_458 = CONCAT17(-(uStack_690._3_1_ < '\0'),
                               CONCAT16(uStack_690._3_1_,
                                        CONCAT15(-(uStack_690._2_1_ < '\0'),
                                                 CONCAT14(uStack_690._2_1_,
                                                          CONCAT13(-(uStack_690._1_1_ < '\0'),
                                                                   CONCAT12(uStack_690._1_1_,
                                                                            CONCAT11(-((char)
                                                  uStack_690 < '\0'),(char)uStack_690)))))));
          uStack_450 = CONCAT17(-(lStack_5c0 < 0),
                                CONCAT16(uStack_690._7_1_,
                                         CONCAT15(-(uStack_690._6_1_ < '\0'),
                                                  CONCAT14(uStack_690._6_1_,
                                                           CONCAT13(-(uStack_690._5_1_ < '\0'),
                                                                    CONCAT12(uStack_690._5_1_,
                                                                             CONCAT11(-(uStack_690.
                                                                                        _4_1_ < '\0'
                                                                                       ),uStack_690.
                                                                                         _4_1_))))))
                               );
          local_478 = CONCAT17(-(local_6b8._3_1_ < '\0'),
                               CONCAT16(local_6b8._3_1_,
                                        CONCAT15(-(local_6b8._2_1_ < '\0'),
                                                 CONCAT14(local_6b8._2_1_,
                                                          CONCAT13(-(local_6b8._1_1_ < '\0'),
                                                                   CONCAT12(local_6b8._1_1_,
                                                                            CONCAT11(-((char)
                                                  local_6b8 < '\0'),(char)local_6b8)))))));
          uStack_470 = CONCAT17(-(local_5e8 < 0),
                                CONCAT16(local_6b8._7_1_,
                                         CONCAT15(-(local_6b8._6_1_ < '\0'),
                                                  CONCAT14(local_6b8._6_1_,
                                                           CONCAT13(-(local_6b8._5_1_ < '\0'),
                                                                    CONCAT12(local_6b8._5_1_,
                                                                             CONCAT11(-(local_6b8.
                                                                                        _4_1_ < '\0'
                                                                                       ),local_6b8.
                                                                                         _4_1_))))))
                               );
          local_18a8 = CONCAT17(-(uStack_6b0._3_1_ < '\0'),
                                CONCAT16(uStack_6b0._3_1_,
                                         CONCAT15(-(uStack_6b0._2_1_ < '\0'),
                                                  CONCAT14(uStack_6b0._2_1_,
                                                           CONCAT13(-(uStack_6b0._1_1_ < '\0'),
                                                                    CONCAT12(uStack_6b0._1_1_,
                                                                             CONCAT11(-((char)
                                                  uStack_6b0 < '\0'),(char)uStack_6b0)))))));
          uStack_490 = CONCAT17(-(lStack_5e0 < 0),
                                CONCAT16(uStack_6b0._7_1_,
                                         CONCAT15(-(uStack_6b0._6_1_ < '\0'),
                                                  CONCAT14(uStack_6b0._6_1_,
                                                           CONCAT13(-(uStack_6b0._5_1_ < '\0'),
                                                                    CONCAT12(uStack_6b0._5_1_,
                                                                             CONCAT11(-(uStack_6b0.
                                                                                        _4_1_ < '\0'
                                                                                       ),uStack_6b0.
                                                                                         _4_1_))))))
                               );
          auVar24._8_8_ = uStack_480;
          auVar24._0_8_ = local_488;
          auVar23._8_8_ = uStack_430;
          auVar23._0_8_ = local_438;
          auVar41 = pmaddwd(auVar24,auVar23);
          local_1ec8 = auVar41._0_8_;
          uStack_1ec0 = auVar41._8_8_;
          uVar1 = local_17d8;
          uVar2 = uStack_17d0;
          local_a98._0_4_ = auVar41._0_4_;
          local_a98._4_4_ = auVar41._4_4_;
          uStack_a90._0_4_ = auVar41._8_4_;
          uStack_a90._4_4_ = auVar41._12_4_;
          local_17d8 = CONCAT44(local_a98._4_4_ + local_aa8._4_4_,(int)local_a98 + (int)local_aa8);
          uStack_17d0 = CONCAT44(uStack_a90._4_4_ + uStack_aa0._4_4_,
                                 (int)uStack_a90 + (int)uStack_aa0);
          auVar22._8_8_ = uStack_480;
          auVar22._0_8_ = local_488;
          auVar21._8_8_ = uStack_450;
          auVar21._0_8_ = local_458;
          auVar41 = pmaddwd(auVar22,auVar21);
          local_1ed8 = auVar41._0_8_;
          uStack_1ed0 = auVar41._8_8_;
          uVar3 = local_17e8;
          uVar4 = uStack_17e0;
          local_ab8._0_4_ = auVar41._0_4_;
          local_ab8._4_4_ = auVar41._4_4_;
          uStack_ab0._0_4_ = auVar41._8_4_;
          uStack_ab0._4_4_ = auVar41._12_4_;
          local_17e8 = CONCAT44(local_ab8._4_4_ + local_ac8._4_4_,(int)local_ab8 + (int)local_ac8);
          uStack_17e0 = CONCAT44(uStack_ab0._4_4_ + uStack_ac0._4_4_,
                                 (int)uStack_ab0 + (int)uStack_ac0);
          auVar20._8_8_ = uStack_480;
          auVar20._0_8_ = local_488;
          auVar19._8_8_ = uStack_470;
          auVar19._0_8_ = local_478;
          auVar41 = pmaddwd(auVar20,auVar19);
          local_1ee8 = auVar41._0_8_;
          uStack_1ee0 = auVar41._8_8_;
          uVar5 = local_17f8;
          uVar6 = uStack_17f0;
          local_ad8._0_4_ = auVar41._0_4_;
          local_ad8._4_4_ = auVar41._4_4_;
          uStack_ad0._0_4_ = auVar41._8_4_;
          uStack_ad0._4_4_ = auVar41._12_4_;
          local_17f8 = CONCAT44(local_ad8._4_4_ + local_ae8._4_4_,(int)local_ad8 + (int)local_ae8);
          uStack_17f0 = CONCAT44(uStack_ad0._4_4_ + uStack_ae0._4_4_,
                                 (int)uStack_ad0 + (int)uStack_ae0);
          auVar18._8_8_ = uStack_480;
          auVar18._0_8_ = local_488;
          auVar17._8_8_ = uStack_490;
          auVar17._0_8_ = local_18a8;
          auVar41 = pmaddwd(auVar18,auVar17);
          local_1ef8 = auVar41._0_8_;
          uStack_1ef0 = auVar41._8_8_;
          uVar7 = local_1808;
          uVar8 = uStack_1800;
          local_af8._0_4_ = auVar41._0_4_;
          local_af8._4_4_ = auVar41._4_4_;
          uStack_af0._0_4_ = auVar41._8_4_;
          uStack_af0._4_4_ = auVar41._12_4_;
          local_1808 = CONCAT44(local_af8._4_4_ + local_b08._4_4_,(int)local_af8 + (int)local_b08);
          uStack_1800 = CONCAT44(uStack_af0._4_4_ + uStack_b00._4_4_,
                                 (int)uStack_af0 + (int)uStack_b00);
          local_1720 = local_1720 + 1;
          local_1770 = local_1770 + 4;
          local_180c = local_180c + 1;
          local_b08 = uVar7;
          uStack_b00 = uVar8;
          local_af8 = local_1ef8;
          uStack_af0 = uStack_1ef0;
          local_ae8 = uVar5;
          uStack_ae0 = uVar6;
          local_ad8 = local_1ee8;
          uStack_ad0 = uStack_1ee0;
          local_ac8 = uVar3;
          uStack_ac0 = uVar4;
          local_ab8 = local_1ed8;
          uStack_ab0 = uStack_1ed0;
          local_aa8 = uVar1;
          uStack_aa0 = uVar2;
          local_a98 = local_1ec8;
          uStack_a90 = uStack_1ec0;
          local_6b8 = local_5e8;
          uStack_6b0 = lStack_5e0;
          local_698 = local_5c8;
          uStack_690 = lStack_5c0;
          local_678 = local_5a8;
          local_538 = local_5f8;
          uStack_530 = uStack_5f0;
          local_528 = local_5e8;
          lStack_520 = lStack_5e0;
          local_518 = local_5d8;
          uStack_510 = uStack_5d0;
          local_508 = local_5c8;
          lStack_500 = lStack_5c0;
          local_498 = local_18a8;
          local_468 = local_488;
          uStack_460 = uStack_480;
          local_448 = local_488;
          uStack_440 = uStack_480;
          local_428 = local_488;
          uStack_420 = uStack_480;
          local_18 = local_5a8;
        }
        local_2e8 = local_17d8;
        uStack_2e0 = uStack_17d0;
        local_2f8 = local_17e8;
        uStack_2f0 = uStack_17e0;
        local_b18 = CONCAT44((int)local_ac8,(int)local_aa8);
        uStack_160 = CONCAT44(local_ac8._4_4_,local_aa8._4_4_);
        local_308 = local_17f8;
        uStack_300 = uStack_17f0;
        local_318 = local_1808;
        uStack_310 = uStack_1800;
        uStack_b10 = CONCAT44((int)local_b08,(int)local_ae8);
        uStack_170 = CONCAT44(local_b08._4_4_,local_ae8._4_4_);
        local_228 = local_17d8;
        uStack_220 = uStack_17d0;
        local_238 = local_17e8;
        uStack_230 = uStack_17e0;
        local_b38 = CONCAT44((int)uStack_ac0,(int)uStack_aa0);
        uStack_180 = CONCAT44(uStack_ac0._4_4_,uStack_aa0._4_4_);
        local_248 = local_17f8;
        uStack_240 = uStack_17f0;
        local_258 = local_1808;
        uStack_250 = uStack_1800;
        uStack_b30 = CONCAT44((int)uStack_b00,(int)uStack_ae0);
        uStack_190 = CONCAT44(uStack_b00._4_4_,uStack_ae0._4_4_);
        iStack_9c = local_ac8._4_4_;
        iStack_ac = local_b08._4_4_;
        local_98 = CONCAT44(local_98._4_4_,(undefined4)local_18a8);
        _local_a8 = CONCAT44((int)local_ac8,(int)local_aa8);
        uStack_b20 = CONCAT44(local_ac8._4_4_,iStack_a0);
        iStack_bc = uStack_ac0._4_4_;
        iStack_cc = uStack_b00._4_4_;
        _local_b8 = CONCAT44((int)local_b08,(int)local_ae8);
        _local_c8 = CONCAT44((int)uStack_ac0,(int)uStack_aa0);
        uStack_b40 = CONCAT44(uStack_ac0._4_4_,iStack_c0);
        local_b28 = (int)local_1f58;
        iStack_b24 = (int)((ulong)local_1f58 >> 0x20);
        local_17d8 = CONCAT44((int)local_ac8 + iStack_b24,(int)local_aa8 + local_b28);
        uStack_17d0 = CONCAT44((int)local_b08 + local_ac8._4_4_,(int)local_ae8 + iStack_a0);
        local_b48 = (int)in_stack_ffffffffffffe088;
        iStack_b44 = (int)(in_stack_ffffffffffffe088 >> 0x20);
        local_17f8 = CONCAT44((int)uStack_ac0 + iStack_b44,(int)uStack_aa0 + local_b48);
        uStack_17f0 = CONCAT44((int)uStack_b00 + uStack_ac0._4_4_,(int)uStack_ae0 + iStack_c0);
        local_b58 = local_17d8;
        uStack_b50 = uStack_17d0;
        local_b68 = local_17f8;
        uStack_b60 = uStack_17f0;
        local_17d8 = CONCAT44((int)local_ac8 + iStack_b24 + (int)uStack_ac0 + iStack_b44,
                              (int)local_aa8 + local_b28 + (int)uStack_aa0 + local_b48);
        uStack_17d0 = CONCAT44((int)local_b08 + local_ac8._4_4_ + (int)uStack_b00 + uStack_ac0._4_4_
                               ,(int)local_ae8 + iStack_a0 + (int)uStack_ae0 + iStack_c0);
        local_850 = local_1448;
        local_868 = local_17d8;
        uStack_860 = uStack_17d0;
        *local_1448 = local_17d8;
        local_1448[1] = uStack_17d0;
        local_1448 = local_1448 + 2;
        local_1170 = local_11b0;
        local_1150 = local_11c0;
        local_b08 = uVar1;
        uStack_b00 = uVar2;
        local_ae8 = uVar3;
        uStack_ae0 = uVar4;
        local_ac8 = uVar5;
        uStack_ac0 = uVar6;
        local_aa8 = uVar7;
        uStack_aa0 = uVar8;
        local_198 = uStack_b30;
        local_188 = local_b38;
        local_178 = uStack_b10;
        local_168 = local_b18;
        local_d8 = uStack_b30;
        local_1798 = local_d48;
      }
      local_1100 = local_11e8;
      local_1470 = local_ca0;
    }
    ppvVar42 = &local_12a8;
    if (local_12a0 != (int *)0x0) {
      local_1184 = 0xffffffff;
      LOCK();
      local_1188 = *local_12a0;
      *local_12a0 = *local_12a0 + -1;
      UNLOCK();
      if (local_1188 == 1) {
        local_11a8 = ppvVar42;
        local_1180 = ppvVar42;
        if (local_1288 == (long *)0x0) {
          local_e00 = local_12a8;
          if (local_12a8 != (void *)0x0) {
            free(local_12a8);
          }
        }
        else {
          (**(code **)(*local_1288 + 0x18))(local_1288,local_12a8);
        }
      }
    }
    *ppvVar42 = (void *)0x0;
    ppvVar42[2] = (void *)0x0;
    *(undefined4 *)(ppvVar42 + 3) = 0;
    *(undefined4 *)(ppvVar42 + 5) = 0;
    *(undefined4 *)((long)ppvVar42 + 0x2c) = 0;
    *(undefined4 *)(ppvVar42 + 6) = 0;
    *(undefined4 *)((long)ppvVar42 + 0x34) = 0;
    *(undefined4 *)(ppvVar42 + 7) = 0;
    ppvVar42[8] = (void *)0x0;
    ppvVar42[1] = (void *)0x0;
  }
  else {
    im2col_sgemm_pack8to4_int8_sse_xop
              (in_stack_ffffffffffffe080,in_stack_ffffffffffffe078,in_stack_ffffffffffffe070,
               in_stack_ffffffffffffe068);
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = size >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_madd_epi16(_val23_16, _w01_16));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_madd_epi16(_val32_16, _w01_16));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_madd_epi16(_val23_16, _w23_16));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_madd_epi16(_val32_16, _w23_16));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
            _mm256_storeu_si256((__m256i*)(outptr0 + 8), _sum04_15);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                _sum02 = _mm_add_epi32(_mm_madd_epi16(_val0, _w2), _sum02);
                _sum03 = _mm_add_epi32(_mm_madd_epi16(_val0, _w3), _sum03);
                _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
                _sum12 = _mm_add_epi32(_mm_madd_epi16(_val1, _w2), _sum12);
                _sum13 = _mm_add_epi32(_mm_madd_epi16(_val1, _w3), _sum13);
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
#endif
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_madd_epi16(_valval, _w01_16));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_madd_epi16(_valval, _w23_16));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val, _w1), _sum1);
                _sum2 = _mm_add_epi32(_mm_madd_epi16(_val, _w2), _sum2);
                _sum3 = _mm_add_epi32(_mm_madd_epi16(_val, _w3), _sum3);
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}